

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O0

bool __thiscall CompoundFile::File::hasDirectory(File *this,wstring *name)

{
  bool bVar1;
  __type _Var2;
  pointer ppVar3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_RSI;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_RDI;
  const_iterator last;
  const_iterator it;
  map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__lhs;
  
  __lhs = in_RDI;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
       ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) {
      return false;
    }
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_CompoundFile::Directory>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_int,_CompoundFile::Directory>_> *)
                        0x12b72e);
    Directory::name_abi_cxx11_(&ppVar3->second);
    _Var2 = std::operator==(__lhs,in_RSI);
    if (_Var2) break;
    std::_Rb_tree_const_iterator<std::pair<const_int,_CompoundFile::Directory>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_int,_CompoundFile::Directory>_> *)in_RDI);
  }
  return true;
}

Assistant:

inline bool
File::hasDirectory( const std::wstring & name ) const
{
	for( std::map< int32_t, Directory >::const_iterator it = m_dirs.begin(),
		last = m_dirs.end(); it != last; ++it )
	{
		if ( it->second.name() == name )
			return true;
	}

	return false;
}